

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

StringFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_stringtype(FeatureType *this)

{
  StringFeatureType *this_00;
  
  if (this->_oneof_case_[0] == 3) {
    this_00 = (StringFeatureType *)(this->Type_).int64type_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 3;
    this_00 = (StringFeatureType *)operator_new(0x18);
    StringFeatureType::StringFeatureType(this_00);
    (this->Type_).stringtype_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::StringFeatureType* FeatureType::mutable_stringtype() {
  if (!has_stringtype()) {
    clear_Type();
    set_has_stringtype();
    Type_.stringtype_ = new ::CoreML::Specification::StringFeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.stringType)
  return Type_.stringtype_;
}